

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

Vector<double,_3U> *
OpenMD::operator*(Vector<double,_3U> *__return_storage_ptr__,RectMatrix<double,_3U,_3U> *m,
                 Vector<double,_3U> *v)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  double dVar3;
  
  Vector<double,_3U>::Vector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar3 = __return_storage_ptr__->data_[lVar1];
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (*(double (*) [3])*(double (*) [3])m)[lVar2] * v->data_[lVar2];
    }
    __return_storage_ptr__->data_[lVar1] = dVar3;
    m = (RectMatrix<double,_3U,_3U> *)((long)m + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<Real, Row> operator*(const RectMatrix<Real, Row, Col>& m,
                                     const Vector<Real, Col>& v) {
    Vector<Real, Row> result;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        result[i] += m(i, j) * v[j];

    return result;
  }